

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.hpp
# Opt level: O1

void cimod::CheckVariables<int>(vector<int,_std::allocator<int>_> *configurations,Vartype *vartype)

{
  int *piVar1;
  uint *puVar2;
  runtime_error *this;
  
  if (*vartype == BINARY) {
    for (puVar2 = (uint *)(configurations->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start;
        puVar2 != (uint *)(configurations->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
      if (1 < *puVar2) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"The initial variables must be 0 or 1");
        goto LAB_00153dde;
      }
    }
  }
  else {
    if (*vartype != SPIN) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Unknown vartype detected");
LAB_00153dde:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (piVar1 = (configurations->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        piVar1 != (configurations->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish; piVar1 = piVar1 + 1) {
      if ((*piVar1 != -1) && (*piVar1 != 1)) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"The initial variables must be -1 or +1");
        goto LAB_00153dde;
      }
    }
  }
  return;
}

Assistant:

void CheckVariables( const std::vector<IntegerType> &configurations, const Vartype &vartype ) {
    if ( vartype == Vartype::SPIN ) {
      for ( const auto &v : configurations ) {
        if ( !( v == -1 || v == +1 ) ) {
          throw std::runtime_error( "The initial variables must be -1 or +1" );
        }
      }
    } else if ( vartype == Vartype::BINARY ) {
      for ( const auto &v : configurations ) {
        if ( !( v == 0 || v == 1 ) ) {
          throw std::runtime_error( "The initial variables must be 0 or 1" );
        }
      }
    } else {
      throw std::runtime_error( "Unknown vartype detected" );
    }
  }